

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

Vec_Int_t * Vec_IntStart(int nSize)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  pVVar1->nCap = 0x10;
  piVar2 = (int *)malloc(0x40);
  pVVar1->pArray = piVar2;
  pVVar1->nSize = 1;
  if (piVar2 != (int *)0x0) {
    *piVar2 = 0;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntAlloc( int nCap )
{
    Vec_Int_t * p;
    p = ABC_ALLOC( Vec_Int_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( int, p->nCap ) : NULL;
    return p;
}